

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O0

int getInstructionLength(mos65xx_address_mode am)

{
  mos65xx_address_mode am_local;
  
  if (am < MOS65XX_AM_ABS) {
    return 1;
  }
  if (am != MOS65XX_AM_ABS) {
    if (am - MOS65XX_AM_ZP < 2) {
      return 2;
    }
    if (1 < am - MOS65XX_AM_ABSX) {
      if (am - MOS65XX_AM_INDX < 5) {
        return 2;
      }
      if (am != MOS65XX_AM_IND) {
        return 1;
      }
    }
  }
  return 3;
}

Assistant:

static int getInstructionLength(mos65xx_address_mode am)
{
	switch(am) {
		case MOS65XX_AM_NONE:
		case MOS65XX_AM_ACC:
		case MOS65XX_AM_IMP:
			return 1;

		case MOS65XX_AM_IMM:
		case MOS65XX_AM_ZPX:
		case MOS65XX_AM_ZPY:
		case MOS65XX_AM_ZP:
		case MOS65XX_AM_REL:
		case MOS65XX_AM_INDX:
		case MOS65XX_AM_INDY:
			return 2;

		case MOS65XX_AM_ABS:
		case MOS65XX_AM_ABSX:
		case MOS65XX_AM_ABSY:
		case MOS65XX_AM_IND:
			return 3;
		default:
			return 1;
	}
}